

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O0

Fra_Man_t * Fra_ManStart(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fra_Man_t *__s;
  uint *puVar5;
  Vec_Ptr_t *pVVar6;
  Fra_Cla_t *pFVar7;
  Aig_Obj_t **ppAVar8;
  void *pvVar9;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Fra_Man_t *p;
  Fra_Par_t *pPars_local;
  Aig_Man_t *pManAig_local;
  
  __s = (Fra_Man_t *)malloc(0x158);
  memset(__s,0,0x158);
  __s->pPars = pPars;
  __s->pManAig = pManAig;
  iVar1 = Aig_ManObjNumMax(pManAig);
  __s->nSizeAlloc = iVar1;
  __s->nFramesAll = pPars->nFramesK + 1;
  iVar2 = Aig_ManCiNum(pManAig);
  iVar3 = Aig_ManRegNum(pManAig);
  iVar1 = __s->nFramesAll;
  iVar4 = Aig_ManRegNum(pManAig);
  iVar1 = Abc_BitWordNum((iVar2 - iVar3) * iVar1 + iVar4);
  __s->nPatWords = iVar1;
  puVar5 = (uint *)malloc((long)__s->nPatWords << 2);
  __s->pPatWords = puVar5;
  pVVar6 = Vec_PtrAlloc(100);
  __s->vPiVars = pVVar6;
  pFVar7 = Fra_ClassesStart(pManAig);
  __s->pCla = pFVar7;
  ppAVar8 = (Aig_Obj_t **)malloc((long)(__s->nSizeAlloc * __s->nFramesAll) << 3);
  __s->pMemFraig = ppAVar8;
  memset(__s->pMemFraig,0,(long)__s->nSizeAlloc * 8 * (long)__s->nFramesAll);
  Aig_ManRandom(1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(__s->pManAig->vObjs), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pvVar9 = Vec_PtrEntry(__s->pManAig->vObjs,local_2c);
    if (pvVar9 != (void *)0x0) {
      *(Fra_Man_t **)((long)pvVar9 + 0x28) = __s;
    }
  }
  return __s;
}

Assistant:

Fra_Man_t * Fra_ManStart( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // allocate the fraiging manager
    p = ABC_ALLOC( Fra_Man_t, 1 );
    memset( p, 0, sizeof(Fra_Man_t) );
    p->pPars      = pPars;
    p->pManAig    = pManAig;
    p->nSizeAlloc = Aig_ManObjNumMax( pManAig );
    p->nFramesAll = pPars->nFramesK + 1;
    // allocate storage for sim pattern
    p->nPatWords  = Abc_BitWordNum( (Aig_ManCiNum(pManAig) - Aig_ManRegNum(pManAig)) * p->nFramesAll + Aig_ManRegNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // equivalence classes
    p->pCla       = Fra_ClassesStart( pManAig );
    // allocate other members
    p->pMemFraig  = ABC_ALLOC( Aig_Obj_t *, p->nSizeAlloc * p->nFramesAll );
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    // set random number generator
//    srand( 0xABCABC );
    Aig_ManRandom(1);
    // set the pointer to the manager
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->pData = p;
    return p;
}